

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O1

void __thiscall QtMWidgets::TableViewCellLayout::heightForWidth(TableViewCellLayout *this)

{
  int in_ESI;
  
  heightForWidth((TableViewCellLayout *)&this[-1].detailedTextLabel,in_ESI);
  return;
}

Assistant:

int
TableViewCellLayout::heightForWidth( int w ) const
{
	const QSize imageSize = imageLabel->sizeHint();
	const QSize accessorySize = accessoryWidget->sizeHint();
	const QMargins m = contentsMargins();

	const int textWidth = qMax( 10,
		w - imageSize.width() - accessorySize.width() );

	int height = textLabel->heightForWidth( textWidth ) +
		detailedTextLabel->heightForWidth( textWidth ) + m.top() + m.bottom();

	height = qMax( height, imageSize.height() + m.top() + m.bottom() );
	height = qMax( height, accessorySize.height() + m.top() + m.bottom() );

	return height;
}